

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::MemoryDataParameter::Clear(MemoryDataParameter *this)

{
  MemoryDataParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    memset(&this->batch_size_,0,0x10);
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void MemoryDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.MemoryDataParameter)
  if (_has_bits_[0 / 32] & 15u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&width_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(width_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}